

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_stam(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 arg2;
  TCGv_i32 arg4;
  TCGv_i32 r3;
  TCGv_i32 r1;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_r1,FLD_C_b1);
  arg2 = tcg_const_i32_s390x(tcg_ctx_00,iVar1);
  iVar1 = get_field1(s,FLD_O_r3,FLD_C_i3);
  arg4 = tcg_const_i32_s390x(tcg_ctx_00,iVar1);
  gen_helper_stam(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,o->in2,arg4);
  tcg_temp_free_i32(tcg_ctx_00,arg2);
  tcg_temp_free_i32(tcg_ctx_00,arg4);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_stam(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 r1 = tcg_const_i32(tcg_ctx, get_field(s, r1));
    TCGv_i32 r3 = tcg_const_i32(tcg_ctx, get_field(s, r3));
    gen_helper_stam(tcg_ctx, tcg_ctx->cpu_env, r1, o->in2, r3);
    tcg_temp_free_i32(tcg_ctx, r1);
    tcg_temp_free_i32(tcg_ctx, r3);
    return DISAS_NEXT;
}